

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

Iterator __thiscall List<String>::removeBack(List<String> *this)

{
  Iterator IVar1;
  Item *local_8;
  undefined4 extraout_var;
  
  local_8 = ((this->_end).item)->prev;
  IVar1.item._0_4_ = remove(this,(char *)&local_8);
  IVar1.item._4_4_ = extraout_var;
  return (Iterator)IVar1.item;
}

Assistant:

Iterator removeBack() {return remove(Iterator(_end.item->prev));}